

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.hpp
# Opt level: O1

unique_ptr<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>_>
 __thiscall
so_5::details::make_message_instance_impl<false,so_5::stats::messages::work_thread_activity>::
make<so_5::stats::prefix_t,so_5::stats::suffix_t,std::thread::id_const&,so_5::stats::work_thread_activity_stats_t_const&>
          (make_message_instance_impl<false,so_5::stats::messages::work_thread_activity> *this,
          prefix_t *args,suffix_t *args_1,id *args_2,work_thread_activity_stats_t *args_3)

{
  uint_fast64_t uVar1;
  _func_int **pp_Var2;
  __int_type _Var3;
  uint_fast64_t uVar4;
  _func_int **pp_Var5;
  __int_type _Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  message_t *this_00;
  
  this_00 = (message_t *)operator_new(0x88);
  uVar1 = (args_3->m_working_stats).m_count;
  pp_Var2 = (_func_int **)(args_3->m_working_stats).m_total_time.__r;
  _Var3 = (args_3->m_working_stats).m_avg_time.__r;
  uVar4 = (args_3->m_waiting_stats).m_count;
  pp_Var5 = (_func_int **)(args_3->m_waiting_stats).m_total_time.__r;
  _Var6 = (args_3->m_waiting_stats).m_avg_time.__r;
  message_t::message_t(this_00);
  this_00->_vptr_message_t = (_func_int **)&PTR__signal_t_0028be48;
  uVar7 = *(undefined8 *)(args->m_value + 8);
  uVar8 = *(undefined8 *)(args->m_value + 0x10);
  uVar9 = *(undefined8 *)(args->m_value + 0x18);
  uVar10 = *(undefined8 *)(args->m_value + 0x10);
  uVar11 = *(undefined8 *)(args->m_value + 0x18);
  uVar12 = *(undefined8 *)(args->m_value + 0x20);
  uVar13 = *(undefined8 *)(args->m_value + 0x28);
  *(undefined8 *)&this_00->field_0x14 = *(undefined8 *)args->m_value;
  *(undefined8 *)((long)&this_00[1]._vptr_message_t + 4) = uVar7;
  *(undefined8 *)
   ((long)&this_00[1].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar8;
  *(undefined8 *)&this_00[1].field_0x14 = uVar9;
  *(undefined8 *)
   ((long)&this_00[1].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar10;
  *(undefined8 *)&this_00[1].field_0x14 = uVar11;
  *(undefined8 *)((long)&this_00[2]._vptr_message_t + 4) = uVar12;
  *(undefined8 *)
   ((long)&this_00[2].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>.
           _M_i + 4) = uVar13;
  this_00[3]._vptr_message_t = (_func_int **)args_1->m_value;
  this_00[3].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>._M_i =
       args_2->_M_thread;
  *(uint_fast64_t *)&this_00[3].m_mutability = uVar1;
  this_00[4]._vptr_message_t = pp_Var2;
  this_00[4].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>._M_i = _Var3
  ;
  *(uint_fast64_t *)&this_00[4].m_mutability = uVar4;
  this_00[4].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>._M_i = _Var3
  ;
  *(uint_fast64_t *)&this_00[4].m_mutability = uVar4;
  this_00[5]._vptr_message_t = pp_Var5;
  this_00[5].super_atomic_refcounted_t.m_ref_counter.super___atomic_base<unsigned_long>._M_i = _Var6
  ;
  *(message_t **)this = this_00;
  return (__uniq_ptr_data<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>,_true,_true>
          )(__uniq_ptr_data<so_5::stats::messages::work_thread_activity,_std::default_delete<so_5::stats::messages::work_thread_activity>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr< E >
		make( ARGS &&... args )
			{
				ensure_not_signal< MSG >();

				return std::unique_ptr< E >( new E( std::forward< ARGS >(args)... ) );
			}